

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlschemas.c
# Opt level: O1

int xmlSchemaParseNewDocWithContext
              (xmlSchemaParserCtxtPtr pctxt,xmlSchemaPtr schema,xmlSchemaBucketPtr_conflict bucket)

{
  int *flags;
  byte *pbVar1;
  uint uVar2;
  xmlSchemaConstructionCtxtPtr pxVar3;
  _xmlSchemaAnnot *p_Var4;
  int iVar5;
  int iVar6;
  int iVar7;
  xmlNodePtr pxVar8;
  xmlAttrPtr pxVar9;
  xmlSchemaTypePtr pxVar10;
  xmlNodePtr pxVar11;
  xmlSchemaPtr pxVar12;
  xmlSchemaAnnotPtr pxVar13;
  xmlSchemaTypePtr pxVar14;
  xmlSchemaTypePtr pxVar15;
  _xmlSchemaType *p_Var16;
  xmlSchemaAttributePtr_conflict pxVar17;
  xmlChar *pxVar18;
  xmlSchemaTypePtr pxVar19;
  char *type;
  xmlSchemaBasicItemPtr extraout_RDX;
  xmlSchemaBasicItemPtr extraout_RDX_00;
  xmlSchemaBasicItemPtr extraout_RDX_01;
  xmlSchemaBasicItemPtr pxVar20;
  xmlSchemaBasicItemPtr extraout_RDX_02;
  long lVar21;
  long lVar22;
  xmlParserErrors error;
  char *in_R8;
  xmlSchemaPtr in_R9;
  char *value;
  xmlChar **uri;
  int oldErrs;
  xmlChar *namespaceName;
  xmlChar *schemaLocation;
  char *in_stack_ffffffffffffff48;
  int in_stack_ffffffffffffff50;
  xmlSchemaPtr in_stack_ffffffffffffff58;
  xmlSchemaBucketPtr_conflict *in_stack_ffffffffffffff60;
  int local_78;
  xmlSchemaPtr local_70;
  _xmlSchemaType *local_68;
  xmlSchemaPtr local_60;
  uint local_54;
  xmlSchemaTypePtr local_50;
  xmlSchemaAttributePtr_conflict local_48;
  xmlSchemaBucketPtr_conflict local_40;
  xmlSchemaTypePtr local_38;
  
  pxVar3 = pctxt->constructor;
  local_38 = (xmlSchemaTypePtr)pxVar3->bucket;
  flags = &schema->flags;
  uVar2 = schema->flags;
  if (uVar2 != 0) {
    if ((uVar2 & 1) != 0) {
      *flags = uVar2 & 0xfffffffe;
    }
    if ((*flags & 2U) != 0) {
      *flags = *flags & 0xfffffffd;
    }
    if ((*flags & 4U) != 0) {
      *flags = *flags & 0xfffffffb;
    }
    if ((*flags & 8U) != 0) {
      *flags = *flags & 0xfffffff7;
    }
    if ((*flags & 0x10U) != 0) {
      *flags = *flags & 0xffffffef;
    }
    if ((*flags & 0x20U) != 0) {
      *flags = *flags & 0xffffffdf;
    }
    if ((*flags & 0x40U) != 0) {
      *flags = *flags & 0xffffffbf;
    }
    if ((char)*flags < '\0') {
      *flags = *flags & 0xffffff7f;
    }
    if (((uint)*flags >> 8 & 1) != 0) {
      *flags = *flags & 0xfffffeff;
    }
  }
  p_Var16 = (_xmlSchemaType *)schema->doc;
  type = (char *)bucket->doc;
  schema->doc = (xmlDocPtr)type;
  pctxt->schema = schema;
  pxVar18 = bucket->targetNamespace;
  pctxt->targetNamespace = pxVar18;
  pxVar3->bucket = bucket;
  if ((pxVar18 != (xmlChar *)0x0) &&
     (iVar5 = xmlStrEqual(pxVar18,(xmlChar *)"http://www.w3.org/2001/XMLSchema"), iVar5 != 0)) {
    pctxt->isS4S = 1;
  }
  bucket->parsed = bucket->parsed + 1;
  pxVar8 = xmlDocGetRootElement(bucket->doc);
  iVar5 = pctxt->nberrors;
  pxVar9 = xmlSchemaGetPropNode(pxVar8,"id");
  local_54 = uVar2;
  if (pxVar9 == (xmlAttrPtr)0x0) {
    local_78 = 0;
  }
  else {
    local_78 = xmlSchemaPValAttrNodeID(pctxt,pxVar9);
  }
  local_68 = p_Var16;
  if (local_78 == -1) {
    local_78 = -1;
    value = (char *)in_R9;
  }
  else {
    pxVar9 = xmlSchemaGetPropNode(pxVar8,"targetNamespace");
    if (pxVar9 == (xmlAttrPtr)0x0) {
LAB_0018f07e:
      pxVar11 = (xmlNodePtr)xmlSchemaGetPropNode(pxVar8,"elementFormDefault");
      if (pxVar11 != (xmlNodePtr)0x0) {
        pxVar12 = (xmlSchemaPtr)xmlSchemaGetNodeContent(pctxt,pxVar11);
        local_78 = 1;
        iVar6 = xmlSchemaPValAttrFormDefault((xmlChar *)pxVar12,flags,1);
        if (iVar6 == 0) {
          local_78 = 0;
        }
        else {
          in_stack_ffffffffffffff48 = (char *)0x0;
          in_stack_ffffffffffffff50 = 0;
          in_R8 = "(qualified | unqualified)";
          type = (char *)0x0;
          xmlSchemaPSimpleTypeErr
                    (pctxt,XML_SCHEMAP_ELEMFORMDEFAULT_VALUE,(xmlSchemaBasicItemPtr)pxVar11,
                     (xmlNodePtr)0x0,(xmlSchemaTypePtr)"(qualified | unqualified)",(char *)pxVar12,
                     (xmlChar *)0x0,(char *)0x0,(xmlChar *)in_stack_ffffffffffffff58,
                     (xmlChar *)in_stack_ffffffffffffff60);
          in_R9 = pxVar12;
        }
      }
      pxVar11 = (xmlNodePtr)xmlSchemaGetPropNode(pxVar8,"attributeFormDefault");
      if (pxVar11 != (xmlNodePtr)0x0) {
        pxVar12 = (xmlSchemaPtr)xmlSchemaGetNodeContent(pctxt,pxVar11);
        local_78 = xmlSchemaPValAttrFormDefault((xmlChar *)pxVar12,flags,2);
        if (local_78 == 0) {
          local_78 = 0;
        }
        else {
          in_stack_ffffffffffffff48 = (char *)0x0;
          in_stack_ffffffffffffff50 = 0;
          in_R8 = "(qualified | unqualified)";
          type = (char *)0x0;
          xmlSchemaPSimpleTypeErr
                    (pctxt,XML_SCHEMAP_ATTRFORMDEFAULT_VALUE,(xmlSchemaBasicItemPtr)pxVar11,
                     (xmlNodePtr)0x0,(xmlSchemaTypePtr)"(qualified | unqualified)",(char *)pxVar12,
                     (xmlChar *)0x0,(char *)0x0,(xmlChar *)in_stack_ffffffffffffff58,
                     (xmlChar *)in_stack_ffffffffffffff60);
          in_R9 = pxVar12;
        }
      }
      pxVar11 = (xmlNodePtr)xmlSchemaGetPropNode(pxVar8,"finalDefault");
      if (pxVar11 != (xmlNodePtr)0x0) {
        in_R9 = (xmlSchemaPtr)xmlSchemaGetNodeContent(pctxt,pxVar11);
        in_stack_ffffffffffffff48 =
             (char *)CONCAT44((int)((ulong)in_stack_ffffffffffffff48 >> 0x20),0x20);
        type = (char *)0x8;
        in_R8 = (char *)0xffffffff;
        value = (char *)0x10;
        local_78 = xmlSchemaPValAttrBlockFinal
                             ((xmlChar *)in_R9,flags,4,8,-1,0x10,0x20,in_stack_ffffffffffffff50);
        if (local_78 == -1) goto LAB_0018f282;
        if (local_78 != 0) {
          in_stack_ffffffffffffff48 = (char *)0x0;
          in_stack_ffffffffffffff50 = 0;
          in_R8 = "(#all | List of (extension | restriction | list | union))";
          type = (char *)0x0;
          xmlSchemaPSimpleTypeErr
                    (pctxt,XML_SCHEMAP_S4S_ATTR_INVALID_VALUE,(xmlSchemaBasicItemPtr)pxVar11,
                     (xmlNodePtr)0x0,
                     (xmlSchemaTypePtr)"(#all | List of (extension | restriction | list | union))",
                     (char *)in_R9,(xmlChar *)0x0,(char *)0x0,(xmlChar *)in_stack_ffffffffffffff58,
                     (xmlChar *)in_stack_ffffffffffffff60);
          local_78 = 1;
        }
      }
      pxVar11 = (xmlNodePtr)xmlSchemaGetPropNode(pxVar8,"blockDefault");
      if (pxVar11 != (xmlNodePtr)0x0) {
        in_R9 = (xmlSchemaPtr)xmlSchemaGetNodeContent(pctxt,pxVar11);
        in_stack_ffffffffffffff48 =
             (char *)CONCAT44((int)((ulong)in_stack_ffffffffffffff48 >> 0x20),0xffffffff);
        type = (char *)0x80;
        in_R8 = (char *)0x100;
        value = (char *)0xffffffff;
        local_78 = xmlSchemaPValAttrBlockFinal
                             ((xmlChar *)in_R9,flags,0x40,0x80,0x100,-1,-1,in_stack_ffffffffffffff50
                             );
        if (local_78 == -1) goto LAB_0018f282;
        if (local_78 != 0) {
          in_stack_ffffffffffffff48 = (char *)0x0;
          in_R8 = "(#all | List of (extension | restriction | substitution))";
          type = (char *)0x0;
          xmlSchemaPSimpleTypeErr
                    (pctxt,XML_SCHEMAP_S4S_ATTR_INVALID_VALUE,(xmlSchemaBasicItemPtr)pxVar11,
                     (xmlNodePtr)0x0,
                     (xmlSchemaTypePtr)"(#all | List of (extension | restriction | substitution))",
                     (char *)in_R9,(xmlChar *)0x0,(char *)0x0,(xmlChar *)in_stack_ffffffffffffff58,
                     (xmlChar *)in_stack_ffffffffffffff60);
        }
      }
    }
    else {
      pxVar10 = xmlSchemaGetBuiltInType(XML_SCHEMAS_ANYURI);
      type = (char *)0x0;
      local_78 = xmlSchemaPValAttrNode
                           (pctxt,(xmlSchemaBasicItemPtr)pxVar9,(xmlAttrPtr)pxVar10,
                            (xmlSchemaTypePtr)0x0,(xmlChar **)in_R8);
      value = (char *)in_R9;
      if (local_78 == -1) goto LAB_0018f282;
      if (local_78 == 0) goto LAB_0018f07e;
      pctxt->stop = 0xbdd;
    }
    value = (char *)in_R9;
    if (iVar5 != pctxt->nberrors) {
      local_78 = pctxt->err;
    }
  }
LAB_0018f282:
  if (local_78 != 0) goto LAB_0019004e;
  pxVar10 = (xmlSchemaTypePtr)pxVar8->children;
  if (pxVar10 != (xmlSchemaTypePtr)0x0) {
    iVar5 = pctxt->nberrors;
    local_78 = 0;
    do {
      if (((((pxVar10->node == (xmlNodePtr)0x0) ||
            (iVar6 = xmlStrEqual(pxVar10->name,(xmlChar *)"include"), iVar6 == 0)) ||
           (iVar6 = xmlStrEqual(pxVar10->node->name,(xmlChar *)"http://www.w3.org/2001/XMLSchema"),
           iVar6 == 0)) &&
          (((pxVar10->node == (xmlNodePtr)0x0 ||
            (iVar6 = xmlStrEqual(pxVar10->name,"import"), iVar6 == 0)) ||
           (iVar6 = xmlStrEqual(pxVar10->node->name,(xmlChar *)"http://www.w3.org/2001/XMLSchema"),
           iVar6 == 0)))) &&
         ((((pxVar10->node == (xmlNodePtr)0x0 ||
            (iVar6 = xmlStrEqual(pxVar10->name,"redefine"), iVar6 == 0)) ||
           (iVar6 = xmlStrEqual(pxVar10->node->name,(xmlChar *)"http://www.w3.org/2001/XMLSchema"),
           iVar6 == 0)) &&
          (((pxVar10->node == (xmlNodePtr)0x0 ||
            (iVar6 = xmlStrEqual(pxVar10->name,(xmlChar *)"annotation"), iVar6 == 0)) ||
           (iVar6 = xmlStrEqual(pxVar10->node->name,(xmlChar *)"http://www.w3.org/2001/XMLSchema"),
           iVar6 == 0)))))) break;
      if (((pxVar10->node == (xmlNodePtr)0x0) ||
          (iVar6 = xmlStrEqual(pxVar10->name,(xmlChar *)"annotation"), iVar6 == 0)) ||
         (iVar6 = xmlStrEqual(pxVar10->node->name,(xmlChar *)"http://www.w3.org/2001/XMLSchema"),
         iVar6 == 0)) {
        if (((pxVar10->node == (xmlNodePtr)0x0) ||
            (iVar6 = xmlStrEqual(pxVar10->name,"import"), iVar6 == 0)) ||
           (iVar6 = xmlStrEqual(pxVar10->node->name,(xmlChar *)"http://www.w3.org/2001/XMLSchema"),
           iVar6 == 0)) {
          if (((pxVar10->node == (xmlNodePtr)0x0) ||
              (iVar6 = xmlStrEqual(pxVar10->name,(xmlChar *)"include"), iVar6 == 0)) ||
             (iVar6 = xmlStrEqual(pxVar10->node->name,(xmlChar *)"http://www.w3.org/2001/XMLSchema")
             , iVar6 == 0)) {
            if (((pxVar10->node == (xmlNodePtr)0x0) ||
                (iVar6 = xmlStrEqual(pxVar10->name,"redefine"), iVar6 == 0)) ||
               (iVar6 = xmlStrEqual(pxVar10->node->name,
                                    (xmlChar *)"http://www.w3.org/2001/XMLSchema"), iVar6 == 0))
            goto LAB_0018f67b;
            iVar6 = pctxt->nberrors;
            type = (char *)0x3;
          }
          else {
            iVar6 = pctxt->nberrors;
            type = (char *)0x2;
          }
          local_78 = xmlSchemaParseIncludeOrRedefine(pctxt,schema,(xmlNodePtr)pxVar10,(int)type);
          if (local_78 != -1) {
            if ((pctxt->stop == 0) && (iVar6 == pctxt->nberrors)) goto LAB_0018f67b;
            goto LAB_00190011;
          }
        }
        else {
          iVar6 = pctxt->nberrors;
          local_70 = (xmlSchemaPtr)0x0;
          local_60 = (xmlSchemaPtr)0x0;
          local_40 = (xmlSchemaBucketPtr_conflict)0x0;
          lVar21._0_4_ = pxVar10->flags;
          lVar21._4_4_ = pxVar10->contentType;
          for (; lVar21 != 0; lVar21 = *(long *)(lVar21 + 0x30)) {
            if (*(long *)(lVar21 + 0x48) == 0) {
              iVar7 = xmlStrEqual(*(xmlChar **)(lVar21 + 0x10),"id");
              if (((iVar7 == 0) &&
                  (iVar7 = xmlStrEqual(*(xmlChar **)(lVar21 + 0x10),"namespace"), iVar7 == 0)) &&
                 (iVar7 = xmlStrEqual(*(xmlChar **)(lVar21 + 0x10),"schemaLocation"),
                 pxVar20 = extraout_RDX_00, iVar7 == 0)) goto LAB_0018f47f;
            }
            else {
              iVar7 = xmlStrEqual(*(xmlChar **)(*(long *)(lVar21 + 0x48) + 0x10),
                                  (xmlChar *)"http://www.w3.org/2001/XMLSchema");
              pxVar20 = extraout_RDX;
              if (iVar7 != 0) {
LAB_0018f47f:
                xmlSchemaPIllegalAttrErr(pctxt,(xmlParserErrors)lVar21,pxVar20,(xmlAttrPtr)type);
              }
            }
          }
          pxVar14 = xmlSchemaGetBuiltInType(XML_SCHEMAS_ANYURI);
          iVar7 = xmlSchemaPValAttr(pctxt,(xmlSchemaBasicItemPtr)pxVar10,(xmlNodePtr)0x1e30f9,
                                    (char *)pxVar14,(xmlSchemaTypePtr)&local_70,(xmlChar **)value);
          type = (char *)xmlSchemaGetBuiltInType(XML_SCHEMAS_ANYURI);
          if (iVar7 == 0) {
            iVar7 = xmlSchemaPValAttr(pctxt,(xmlSchemaBasicItemPtr)pxVar10,(xmlNodePtr)0x1e31fc,type
                                      ,(xmlSchemaTypePtr)&local_60,(xmlChar **)value);
            if (iVar7 == 0) {
              pxVar8 = (xmlNodePtr)pxVar10->id;
              if (pxVar8 == (xmlNodePtr)0x0) {
                pxVar8 = (xmlNodePtr)0x0;
              }
              else if (((pxVar8->ns != (xmlNs *)0x0) &&
                       (iVar7 = xmlStrEqual(pxVar8->name,(xmlChar *)"annotation"), iVar7 != 0)) &&
                      (iVar7 = xmlStrEqual(pxVar8->ns->href,
                                           (xmlChar *)"http://www.w3.org/2001/XMLSchema"),
                      iVar7 != 0)) {
                pxVar8 = pxVar8->next;
              }
              if (pxVar8 != (xmlNodePtr)0x0) {
                xmlSchemaPContentErr
                          (pctxt,XML_SCHEMAP_S4S_ELEM_NOT_ALLOWED,(xmlSchemaBasicItemPtr)pxVar10,
                           pxVar8,(xmlNodePtr)0x0,"(annotation?)",in_stack_ffffffffffffff48);
              }
              pxVar12 = (xmlSchemaPtr)pctxt->constructor->bucket->origTargetNamespace;
              if (local_70 == (xmlSchemaPtr)0x0) {
                if (pxVar12 != (xmlSchemaPtr)0x0) goto LAB_0018f743;
                error = XML_SCHEMAP_SRC_IMPORT_1_2;
                in_R8 = 
                "The attribute \'namespace\' must be existent if the importing schema has no target namespace"
                ;
                pxVar12 = (xmlSchemaPtr)0x0;
              }
              else {
                iVar7 = xmlStrEqual((xmlChar *)pxVar12,(xmlChar *)local_70);
                if (iVar7 == 0) {
LAB_0018f743:
                  if (local_60 != (xmlSchemaPtr)0x0) {
                    local_60 = (xmlSchemaPtr)
                               xmlSchemaBuildAbsoluteURI
                                         (pctxt->dict,(xmlChar *)local_60,(xmlNodePtr)pxVar10);
                  }
                  in_stack_ffffffffffffff60 = &local_40;
                  type = (char *)0x0;
                  in_R8 = (char *)0x0;
                  value = (char *)0x0;
                  in_stack_ffffffffffffff48 = (char *)pxVar10;
                  in_stack_ffffffffffffff58 = local_70;
                  local_78 = xmlSchemaAddSchemaDoc
                                       (pctxt,1,(xmlChar *)local_60,(xmlDocPtr)0x0,(char *)0x0,0,
                                        (xmlNodePtr)pxVar10,(xmlChar *)pxVar12,(xmlChar *)local_70,
                                        in_stack_ffffffffffffff60);
                  if (local_78 == 0) {
                    type = (char *)CONCAT71((int7)((ulong)type >> 8),
                                            local_60 != (xmlSchemaPtr)0x0 &&
                                            local_40 == (xmlSchemaBucketPtr_conflict)0x0);
                    in_R8 = (char *)local_60;
                    if (local_60 != (xmlSchemaPtr)0x0 &&
                        local_40 == (xmlSchemaBucketPtr_conflict)0x0) {
                      in_stack_ffffffffffffff48 = (char *)0x0;
                      type = "Failed to locate a schema at location \'%s\'. Skipping the import";
                      value = (char *)0x0;
                      xmlSchemaCustomWarning
                                ((xmlSchemaAbstractCtxtPtr)pctxt,XML_SCHEMAP_WARN_UNLOCATED_SCHEMA,
                                 (xmlNodePtr)pxVar10,
                                 (xmlSchemaTypePtr)
                                 "Failed to locate a schema at location \'%s\'. Skipping the import"
                                 ,(char *)local_60,(xmlChar *)0x0,(xmlChar *)0x0,(xmlChar *)pxVar12)
                      ;
                    }
                    if ((local_40 == (xmlSchemaBucketPtr_conflict)0x0) ||
                       (local_40->doc == (xmlDocPtr)0x0)) {
                      local_78 = 0;
                    }
                    else {
                      local_78 = 0;
                      if (local_40->parsed == 0) {
                        local_78 = xmlSchemaParseNewDoc(pctxt,schema,local_40);
                      }
                    }
                  }
                  goto LAB_0018f652;
                }
                error = XML_SCHEMAP_SRC_IMPORT_1_1;
                in_R8 = 
                "The value of the attribute \'namespace\' must not match the target namespace \'%s\' of the importing schema"
                ;
              }
              in_stack_ffffffffffffff48 = (char *)0x0;
              type = (char *)pxVar10;
              xmlSchemaPCustomErrExt
                        (pctxt,error,(xmlSchemaBasicItemPtr)0x0,(xmlNodePtr)pxVar10,in_R8,
                         (xmlChar *)pxVar12,(xmlChar *)0x0,(xmlChar *)0x0);
              value = (char *)pxVar12;
              goto LAB_0018f5ea;
            }
            type = (char *)xmlSchemaGetBuiltInType(XML_SCHEMAS_ANYURI);
            in_stack_ffffffffffffff48 = (char *)0x0;
            in_R8 = (char *)0x0;
            value = (char *)local_60;
            xmlSchemaPSimpleTypeErr
                      (pctxt,XML_SCHEMAP_S4S_ATTR_INVALID_VALUE,(xmlSchemaBasicItemPtr)pxVar10,
                       (xmlNodePtr)type,(xmlSchemaTypePtr)0x0,(char *)local_60,(xmlChar *)0x0,
                       (char *)0x0,(xmlChar *)in_stack_ffffffffffffff58,
                       (xmlChar *)in_stack_ffffffffffffff60);
            local_78 = pctxt->err;
          }
          else {
            in_stack_ffffffffffffff48 = (char *)0x0;
            in_R8 = (char *)0x0;
            value = (char *)local_70;
            xmlSchemaPSimpleTypeErr
                      (pctxt,XML_SCHEMAP_S4S_ATTR_INVALID_VALUE,(xmlSchemaBasicItemPtr)pxVar10,
                       (xmlNodePtr)type,(xmlSchemaTypePtr)0x0,(char *)local_70,(xmlChar *)0x0,
                       (char *)0x0,(xmlChar *)in_stack_ffffffffffffff58,
                       (xmlChar *)in_stack_ffffffffffffff60);
LAB_0018f5ea:
            local_78 = pctxt->err;
          }
LAB_0018f652:
          if (local_78 != -1) {
            if ((pctxt->stop == 0) && (iVar6 == pctxt->nberrors)) goto LAB_0018f67b;
            goto LAB_00190011;
          }
        }
        local_78 = -1;
        goto LAB_00190039;
      }
      pxVar13 = xmlSchemaParseAnnotation(pctxt,(xmlNodePtr)pxVar10,1);
      if (schema->annot == (xmlSchemaAnnotPtr)0x0) {
        schema->annot = pxVar13;
      }
      else if (pxVar13 != (xmlSchemaAnnotPtr)0x0) {
        if (pxVar13->next == (_xmlSchemaAnnot *)0x0) {
          (*xmlFree)(pxVar13);
        }
        else {
          do {
            p_Var4 = pxVar13->next;
            (*xmlFree)(pxVar13);
            pxVar13 = p_Var4;
          } while (p_Var4 != (_xmlSchemaAnnot *)0x0);
        }
      }
LAB_0018f67b:
      pxVar10 = (xmlSchemaTypePtr)pxVar10->annot;
    } while (pxVar10 != (xmlSchemaTypePtr)0x0);
joined_r0x0018f846:
    if (pxVar10 != (xmlSchemaTypePtr)0x0) {
      if (((pxVar10->node == (xmlNodePtr)0x0) ||
          (iVar6 = xmlStrEqual(pxVar10->name,(xmlChar *)"complexType"), iVar6 == 0)) ||
         (iVar6 = xmlStrEqual(pxVar10->node->name,(xmlChar *)"http://www.w3.org/2001/XMLSchema"),
         iVar6 == 0)) {
        if (((pxVar10->node == (xmlNodePtr)0x0) ||
            (iVar6 = xmlStrEqual(pxVar10->name,"simpleType"), iVar6 == 0)) ||
           (iVar6 = xmlStrEqual(pxVar10->node->name,(xmlChar *)"http://www.w3.org/2001/XMLSchema"),
           iVar6 == 0)) {
          if (((pxVar10->node == (xmlNodePtr)0x0) ||
              (iVar6 = xmlStrEqual(pxVar10->name,"element"), iVar6 == 0)) ||
             (iVar6 = xmlStrEqual(pxVar10->node->name,(xmlChar *)"http://www.w3.org/2001/XMLSchema")
             , iVar6 == 0)) {
            pxVar14 = pxVar10;
            if (((pxVar10->node == (xmlNodePtr)0x0) ||
                (iVar6 = xmlStrEqual(pxVar10->name,"attribute"), iVar6 == 0)) ||
               (iVar6 = xmlStrEqual(pxVar10->node->name,
                                    (xmlChar *)"http://www.w3.org/2001/XMLSchema"), iVar6 == 0)) {
              if (((pxVar10->node == (xmlNodePtr)0x0) ||
                  (iVar6 = xmlStrEqual(pxVar10->name,(xmlChar *)"attributeGroup"), iVar6 == 0)) ||
                 (iVar6 = xmlStrEqual(pxVar10->node->name,
                                      (xmlChar *)"http://www.w3.org/2001/XMLSchema"), iVar6 == 0)) {
                if (((pxVar10->node == (xmlNodePtr)0x0) ||
                    (iVar6 = xmlStrEqual(pxVar10->name,"group"), iVar6 == 0)) ||
                   (iVar6 = xmlStrEqual(pxVar10->node->name,
                                        (xmlChar *)"http://www.w3.org/2001/XMLSchema"), iVar6 == 0))
                {
                  if (((pxVar10->node == (xmlNodePtr)0x0) ||
                      (iVar6 = xmlStrEqual(pxVar10->name,"notation"), iVar6 == 0)) ||
                     (iVar6 = xmlStrEqual(pxVar10->node->name,
                                          (xmlChar *)"http://www.w3.org/2001/XMLSchema"), iVar6 == 0
                     )) {
                    pxVar14 = (xmlSchemaTypePtr)pxVar10->refNs;
                    value = 
                    "((include | import | redefine | annotation)*, (((simpleType | complexType | group | attributeGroup) | element | attribute | notation), annotation*)*)"
                    ;
                    type = (char *)pxVar10;
LAB_0018fb65:
                    in_R8 = (char *)0x0;
                    xmlSchemaPContentErr
                              (pctxt,XML_SCHEMAP_S4S_ELEM_NOT_ALLOWED,(xmlSchemaBasicItemPtr)pxVar14
                               ,(xmlNodePtr)type,(xmlNodePtr)0x0,value,in_stack_ffffffffffffff48);
                  }
                  else {
                    p_Var16 = (_xmlSchemaType *)xmlSchemaGetProp(pctxt,(xmlNodePtr)pxVar10,"name");
                    if (p_Var16 == (_xmlSchemaType *)0x0) {
                      in_stack_ffffffffffffff48 = (char *)0x0;
                      in_stack_ffffffffffffff58 = (xmlSchemaPtr)0x0;
                      type = (char *)0x2;
                      xmlSchemaPErrFull(pctxt,(xmlNodePtr)pxVar10,0x6bb,XML_ERR_ERROR,in_R8,
                                        (int)value,(xmlChar *)0x0,(xmlChar *)0x0,(xmlChar *)0x0,
                                        (int)in_stack_ffffffffffffff60,"Notation has no name\n",0,0)
                      ;
                      goto LAB_0018ff79;
                    }
                    pxVar18 = pctxt->targetNamespace;
                    pxVar15 = (xmlSchemaTypePtr)(*xmlMalloc)(0x28);
                    if (pxVar15 == (xmlSchemaTypePtr)0x0) {
                      xmlSchemaPErrMemory(pctxt);
LAB_0018fbc7:
                      pxVar15 = (xmlSchemaTypePtr)0x0;
                    }
                    else {
                      *(undefined8 *)pxVar15 = 0;
                      pxVar15->next = (_xmlSchemaType *)0x0;
                      pxVar15->name = (xmlChar *)0x0;
                      pxVar15->id = (xmlChar *)0x0;
                      pxVar15->type = XML_SCHEMA_TYPE_NOTATION;
                      pxVar15->next = p_Var16;
                      pxVar15->ref = pxVar18;
                      type = (char *)pctxt->constructor;
                      iVar6 = xmlSchemaAddItemSize
                                        ((xmlSchemaItemListPtr *)
                                         (((xmlSchemaTypePtr)type)->ref + 0x40),5,pxVar15);
                      if (iVar6 < 0) {
                        xmlSchemaPErrMemory(pctxt);
                        (*xmlFree)(pxVar15);
                        goto LAB_0018fbc7;
                      }
                    }
                    if (pxVar15 != (xmlSchemaTypePtr)0x0) {
                      pxVar9 = xmlSchemaGetPropNode((xmlNodePtr)pxVar10,"id");
                      if (pxVar9 != (xmlAttrPtr)0x0) {
                        xmlSchemaPValAttrNodeID(pctxt,pxVar9);
                      }
                      pxVar19 = (xmlSchemaTypePtr)pxVar10->id;
                      if (pxVar19 == (xmlSchemaTypePtr)0x0) {
                        pxVar19 = (xmlSchemaTypePtr)0x0;
                      }
                      else if (((pxVar19->node != (xmlNodePtr)0x0) &&
                               (iVar6 = xmlStrEqual(pxVar19->name,(xmlChar *)"annotation"),
                               iVar6 != 0)) &&
                              (iVar6 = xmlStrEqual(pxVar19->node->name,
                                                   (xmlChar *)"http://www.w3.org/2001/XMLSchema"),
                              iVar6 != 0)) {
                        pxVar13 = xmlSchemaParseAnnotation(pctxt,(xmlNodePtr)pxVar19,1);
                        pxVar15->name = (xmlChar *)pxVar13;
                        pxVar19 = (xmlSchemaTypePtr)pxVar19->annot;
                        type = (char *)pxVar15;
                      }
                      if (pxVar19 != (xmlSchemaTypePtr)0x0) {
                        value = "(annotation?)";
                        type = (char *)pxVar19;
                        goto LAB_0018fb65;
                      }
                    }
                  }
                }
                else {
                  xmlSchemaParseModelGroupDefinition(pctxt,schema,(xmlNodePtr)pxVar10);
                }
              }
              else {
                xmlSchemaParseAttributeGroupDefinition(pctxt,schema,(xmlNodePtr)pxVar10);
              }
            }
            else {
              pxVar9 = xmlSchemaGetPropNode((xmlNodePtr)pxVar10,"name");
              if (pxVar9 == (xmlAttrPtr)0x0) {
                xmlSchemaPMissingAttrErr
                          (pctxt,(xmlParserErrors)pxVar10,(xmlSchemaBasicItemPtr)0x1cc054,
                           (xmlNodePtr)type,in_R8,value);
              }
              else {
                pxVar15 = xmlSchemaGetBuiltInType(XML_SCHEMAS_NCNAME);
                type = (char *)&local_70;
                iVar6 = xmlSchemaPValAttrNode
                                  (pctxt,(xmlSchemaBasicItemPtr)pxVar9,(xmlAttrPtr)pxVar15,
                                   (xmlSchemaTypePtr)type,(xmlChar **)in_R8);
                if (iVar6 == 0) {
                  iVar6 = xmlStrEqual((xmlChar *)local_70,"xmlns");
                  if (iVar6 == 0) {
                    iVar6 = xmlStrEqual(pctxt->targetNamespace,
                                        (xmlChar *)"http://www.w3.org/2001/XMLSchema-instance");
                    if (iVar6 != 0) {
                      in_stack_ffffffffffffff48 = (char *)0x0;
                      in_stack_ffffffffffffff58 = (xmlSchemaPtr)0x0;
                      value = "http://www.w3.org/2001/XMLSchema-instance";
                      xmlSchemaCustomErr4((xmlSchemaAbstractCtxtPtr)pctxt,XML_SCHEMAP_NO_XSI,
                                          (xmlNodePtr)pxVar10,(xmlSchemaBasicItemPtr)0x0,
                                          "The target namespace must not match \'%s\'",
                                          (xmlChar *)"http://www.w3.org/2001/XMLSchema-instance",
                                          (xmlChar *)0x0,(xmlChar *)0x0,(xmlChar *)0x0);
                    }
                    in_R8 = &DAT_00000001;
                    type = (char *)pxVar10;
                    pxVar17 = xmlSchemaAddAttribute
                                        (pctxt,local_70,pctxt->targetNamespace,(xmlChar *)pxVar10,
                                         (xmlNodePtr)&DAT_00000001,(int)value);
                    if (pxVar17 != (xmlSchemaAttributePtr_conflict)0x0) {
                      *(byte *)&pxVar17->flags = (byte)pxVar17->flags | 1;
                      lVar22._0_4_ = pxVar10->flags;
                      lVar22._4_4_ = pxVar10->contentType;
                      local_48 = pxVar17;
                      for (; lVar22 != 0; lVar22 = *(long *)(lVar22 + 0x30)) {
                        if (*(long *)(lVar22 + 0x48) == 0) {
                          iVar6 = xmlStrEqual(*(xmlChar **)(lVar22 + 0x10),"id");
                          if (((iVar6 == 0) &&
                              (iVar6 = xmlStrEqual(*(xmlChar **)(lVar22 + 0x10),"default"),
                              iVar6 == 0)) &&
                             ((iVar6 = xmlStrEqual(*(xmlChar **)(lVar22 + 0x10),(xmlChar *)"fixed"),
                              iVar6 == 0 &&
                              ((iVar6 = xmlStrEqual(*(xmlChar **)(lVar22 + 0x10),"name"), iVar6 == 0
                               && (iVar6 = xmlStrEqual(*(xmlChar **)(lVar22 + 0x10),"type"),
                                  pxVar20 = extraout_RDX_02, iVar6 == 0)))))) goto LAB_0018fd00;
                        }
                        else {
                          iVar6 = xmlStrEqual(*(xmlChar **)(*(long *)(lVar22 + 0x48) + 0x10),
                                              (xmlChar *)"http://www.w3.org/2001/XMLSchema");
                          pxVar20 = extraout_RDX_01;
                          if (iVar6 != 0) {
LAB_0018fd00:
                            xmlSchemaPIllegalAttrErr
                                      (pctxt,(xmlParserErrors)lVar22,pxVar20,(xmlAttrPtr)type);
                          }
                        }
                      }
                      in_R8 = (char *)&pxVar17->typeNs;
                      uri = &pxVar17->typeName;
                      value = (char *)uri;
                      xmlSchemaPValAttrQName
                                (pctxt,schema,(xmlSchemaBasicItemPtr)pxVar10,(xmlNodePtr)0x1e3ec0,
                                 in_R8,uri,(xmlChar **)in_stack_ffffffffffffff48);
                      pxVar9 = xmlSchemaGetPropNode((xmlNodePtr)pxVar10,"id");
                      if (pxVar9 != (xmlAttrPtr)0x0) {
                        xmlSchemaPValAttrNodeID(pctxt,pxVar9);
                      }
                      pxVar18 = xmlSchemaGetProp(pctxt,(xmlNodePtr)pxVar10,"fixed");
                      pxVar17 = local_48;
                      local_48->defValue = pxVar18;
                      if (pxVar18 != (xmlChar *)0x0) {
                        pbVar1 = (byte *)((long)&local_48->flags + 1);
                        *pbVar1 = *pbVar1 | 2;
                      }
                      pxVar8 = (xmlNodePtr)xmlSchemaGetPropNode((xmlNodePtr)pxVar10,"default");
                      if (pxVar8 != (xmlNodePtr)0x0) {
                        if ((pxVar17->flags & 0x200) == 0) {
                          pxVar18 = xmlSchemaGetNodeContent(pctxt,pxVar8);
                          pxVar17->defValue = pxVar18;
                        }
                        else {
                          in_R8 = "default";
                          value = "fixed";
                          xmlSchemaPMutualExclAttrErr
                                    (pctxt,XML_SCHEMAP_SRC_ATTRIBUTE_1,
                                     (xmlSchemaBasicItemPtr)pxVar17,(xmlAttrPtr)pxVar8,"default",
                                     "fixed");
                        }
                      }
                      type = (char *)pxVar10->id;
                      if ((xmlSchemaTypePtr)type == (xmlSchemaTypePtr)0x0) {
                        type = (char *)0x0;
                      }
                      else if (((((xmlSchemaTypePtr)type)->node != (xmlNodePtr)0x0) &&
                               (iVar6 = xmlStrEqual(((xmlSchemaTypePtr)type)->name,
                                                    (xmlChar *)"annotation"), iVar6 != 0)) &&
                              (iVar6 = xmlStrEqual(((xmlSchemaTypePtr)type)->node->name,
                                                   (xmlChar *)"http://www.w3.org/2001/XMLSchema"),
                              iVar6 != 0)) {
                        pxVar13 = xmlSchemaParseAnnotation(pctxt,(xmlNodePtr)type,1);
                        local_48->annot = pxVar13;
                        type = (char *)((xmlSchemaTypePtr)type)->annot;
                      }
                      if ((xmlSchemaTypePtr)type == (xmlSchemaTypePtr)0x0) {
                        type = (char *)(xmlSchemaTypePtr)0x0;
                      }
                      else if (((((xmlSchemaTypePtr)type)->node != (xmlNodePtr)0x0) &&
                               (iVar6 = xmlStrEqual(((xmlSchemaTypePtr)type)->name,"simpleType"),
                               iVar6 != 0)) &&
                              (local_50 = (xmlSchemaTypePtr)type,
                              iVar6 = xmlStrEqual(((xmlSchemaTypePtr)type)->node->name,
                                                  (xmlChar *)"http://www.w3.org/2001/XMLSchema"),
                              pxVar15 = local_50, type = (char *)local_50, iVar6 != 0)) {
                        if (*uri == (xmlChar *)0x0) {
                          pxVar19 = xmlSchemaParseSimpleType(pctxt,schema,(xmlNodePtr)local_50,0);
                          local_48->subtypes = pxVar19;
                        }
                        else {
                          in_R8 = 
                          "The attribute \'type\' and the <simpleType> child are mutually exclusive"
                          ;
                          value = (char *)0x0;
                          xmlSchemaPContentErr
                                    (pctxt,XML_SCHEMAP_SRC_ATTRIBUTE_4,
                                     (xmlSchemaBasicItemPtr)pxVar10,(xmlNodePtr)local_50,
                                     (xmlNodePtr)
                                     "The attribute \'type\' and the <simpleType> child are mutually exclusive"
                                     ,(char *)0x0,in_stack_ffffffffffffff48);
                        }
                        type = (char *)pxVar15->annot;
                      }
                      if ((xmlSchemaTypePtr)type != (xmlSchemaTypePtr)0x0) {
                        value = "(annotation?, simpleType?)";
                        goto LAB_0018fb65;
                      }
                    }
                  }
                  else {
                    type = (char *)xmlSchemaGetBuiltInType(XML_SCHEMAS_NCNAME);
                    in_stack_ffffffffffffff48 =
                         "The value of the attribute must not match \'xmlns\'";
                    in_R8 = (char *)0x0;
                    value = (char *)0x0;
                    xmlSchemaPSimpleTypeErr
                              (pctxt,XML_SCHEMAP_NO_XMLNS,(xmlSchemaBasicItemPtr)pxVar9,
                               (xmlNodePtr)type,(xmlSchemaTypePtr)0x0,(char *)0x0,
                               (xmlChar *)"The value of the attribute must not match \'xmlns\'",
                               (char *)0x0,(xmlChar *)in_stack_ffffffffffffff58,
                               (xmlChar *)in_stack_ffffffffffffff60);
                  }
                }
              }
            }
          }
          else {
            type = (char *)0x0;
            in_R8 = &DAT_00000001;
            xmlSchemaParseElement(pctxt,schema,(xmlNodePtr)pxVar10,(int *)0x0,1);
          }
        }
        else {
          type = &DAT_00000001;
          xmlSchemaParseSimpleType(pctxt,schema,(xmlNodePtr)pxVar10,1);
        }
      }
      else {
        type = &DAT_00000001;
        xmlSchemaParseComplexType(pctxt,schema,(xmlNodePtr)pxVar10,1);
      }
LAB_0018ff79:
      pxVar10 = (xmlSchemaTypePtr)pxVar10->annot;
      while (((pxVar10 != (xmlSchemaTypePtr)0x0 && (pxVar10->node != (xmlNodePtr)0x0)) &&
             ((iVar6 = xmlStrEqual(pxVar10->name,(xmlChar *)"annotation"), iVar6 != 0 &&
              (iVar6 = xmlStrEqual(pxVar10->node->name,(xmlChar *)"http://www.w3.org/2001/XMLSchema"
                                  ), iVar6 != 0))))) {
        pxVar13 = xmlSchemaParseAnnotation(pctxt,(xmlNodePtr)pxVar10,1);
        if (schema->annot == (xmlSchemaAnnotPtr)0x0) {
          schema->annot = pxVar13;
        }
        else if (pxVar13 != (xmlSchemaAnnotPtr)0x0) {
          if (pxVar13->next == (_xmlSchemaAnnot *)0x0) {
            (*xmlFree)(pxVar13);
          }
          else {
            do {
              p_Var4 = pxVar13->next;
              (*xmlFree)(pxVar13);
              pxVar13 = p_Var4;
            } while (p_Var4 != (_xmlSchemaAnnot *)0x0);
          }
        }
        pxVar10 = (xmlSchemaTypePtr)pxVar10->annot;
      }
      goto joined_r0x0018f846;
    }
LAB_00190011:
    pctxt->ctxtType = (xmlSchemaTypePtr)0x0;
    if (iVar5 != pctxt->nberrors) {
      local_78 = pctxt->err;
    }
LAB_00190039:
    if (local_78 != 0) goto LAB_0019004e;
    if (iVar5 != pctxt->nberrors) {
      local_78 = pctxt->err;
      goto LAB_0019004e;
    }
  }
  local_78 = 0;
LAB_0019004e:
  pctxt->constructor->bucket = (xmlSchemaBucketPtr_conflict)local_38;
  schema->doc = (xmlDocPtr)local_68;
  schema->flags = local_54;
  return local_78;
}

Assistant:

static int
xmlSchemaParseNewDocWithContext(xmlSchemaParserCtxtPtr pctxt,
		     xmlSchemaPtr schema,
		     xmlSchemaBucketPtr bucket)
{
    int oldFlags;
    xmlDocPtr oldDoc;
    xmlNodePtr node;
    int ret, oldErrs;
    xmlSchemaBucketPtr oldbucket = pctxt->constructor->bucket;

    /*
    * Save old values; reset the *main* schema.
    * URGENT TODO: This is not good; move the per-document information
    * to the parser. Get rid of passing the main schema to the
    * parsing functions.
    */
    oldFlags = schema->flags;
    oldDoc = schema->doc;
    if (schema->flags != 0)
	xmlSchemaClearSchemaDefaults(schema);
    schema->doc = bucket->doc;
    pctxt->schema = schema;
    /*
    * Keep the current target namespace on the parser *not* on the
    * main schema.
    */
    pctxt->targetNamespace = bucket->targetNamespace;
    WXS_CONSTRUCTOR(pctxt)->bucket = bucket;

    if ((bucket->targetNamespace != NULL) &&
	xmlStrEqual(bucket->targetNamespace, xmlSchemaNs)) {
	/*
	* We are parsing the schema for schemas!
	*/
	pctxt->isS4S = 1;
    }
    /* Mark it as parsed, even if parsing fails. */
    bucket->parsed++;
    /* Compile the schema doc. */
    node = xmlDocGetRootElement(bucket->doc);
    ret = xmlSchemaParseSchemaElement(pctxt, schema, node);
    if (ret != 0)
	goto exit;
    /* An empty schema; just get out. */
    if (node->children == NULL)
	goto exit;
    oldErrs = pctxt->nberrors;
    ret = xmlSchemaParseSchemaTopLevel(pctxt, schema, node->children);
    if (ret != 0)
	goto exit;
    /*
    * TODO: Not nice, but I'm not 100% sure we will get always an error
    * as a result of the above functions; so better rely on pctxt->err
    * as well.
    */
    if ((ret == 0) && (oldErrs != pctxt->nberrors)) {
	ret = pctxt->err;
	goto exit;
    }

exit:
    WXS_CONSTRUCTOR(pctxt)->bucket = oldbucket;
    /* Restore schema values. */
    schema->doc = oldDoc;
    schema->flags = oldFlags;
    return(ret);
}